

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O3

bool libwebm::vttdemux::WriteChaptersFile(metadata_map_t *m,Segment *s)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  _Base_ptr p_Var4;
  Chapters *this;
  Edition *this_00;
  Atom *this_01;
  Display *this_02;
  char *pcVar5;
  bool bVar6;
  int index;
  _Rb_tree_header *p_Var7;
  _Base_ptr p_Var8;
  
  p_Var4 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  bVar6 = true;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var7 = &(m->_M_t)._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var7->_M_header;
    do {
      if (-1 < *(long *)(p_Var4 + 1)) {
        p_Var8 = p_Var4;
      }
      p_Var4 = *(_Base_ptr *)((long)p_Var4 + (*(long *)(p_Var4 + 1) >> 0x3f) * -8 + 0x10);
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var8 != p_Var7) && (*(long *)(p_Var8 + 1) < 1)) &&
       (this = mkvparser::Segment::GetChapters(s), this != (Chapters *)0x0)) {
      p_Var4 = p_Var8[1]._M_left;
      iVar2 = mkvparser::Chapters::GetEditionCount(this);
      if (0 < iVar2) {
        if (iVar2 == 1) {
          index = 0;
          this_00 = mkvparser::Chapters::GetEdition(this,0);
          iVar2 = mkvparser::Chapters::Edition::GetAtomCount(this_00);
          if (0 < iVar2) {
            do {
              this_01 = mkvparser::Chapters::Edition::GetAtom(this_00,index);
              iVar3 = mkvparser::Chapters::Atom::GetDisplayCount(this_01);
              if (0 < iVar3) {
                if (iVar3 != 1) {
                  pcVar5 = "more than 1 display in atom detected";
                  goto LAB_0010da90;
                }
                this_02 = mkvparser::Chapters::Atom::GetDisplay(this_01,0);
                pcVar5 = mkvparser::Chapters::Display::GetLanguage(this_02);
                if ((pcVar5 != (char *)0x0) && (iVar3 = strcmp(pcVar5,"eng"), iVar3 != 0)) {
                  pcVar5 = "only English-language chapter cues are supported";
                  goto LAB_0010da90;
                }
                bVar1 = WriteChaptersCue((FILE *)p_Var4,this,this_01,this_02);
                if (!bVar1) goto LAB_0010da95;
              }
              index = index + 1;
            } while (iVar2 != index);
          }
        }
        else {
          pcVar5 = "more than one chapter edition detected";
LAB_0010da90:
          puts(pcVar5);
LAB_0010da95:
          bVar6 = false;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool vttdemux::ProcessCluster(const metadata_map_t& m,
                              const mkvparser::Cluster* c) {
  // Visit the blocks in this cluster, writing a WebVTT cue for each
  // metadata block.

  const mkvparser::BlockEntry* block_entry;

  long result = c->GetFirst(block_entry);  // NOLINT
  if (result < 0) {
    printf("bad cluster (unable to get first block)\n");
    return false;
  }

  while (block_entry != NULL && !block_entry->EOS()) {
    if (!ProcessBlockEntry(m, block_entry))
      return false;

    result = c->GetNext(block_entry, block_entry);
    if (result < 0) {  // error
      printf("bad cluster (unable to get next block)\n");
      return false;
    }
  }

  return true;
}